

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O1

void help(TidyDoc tdoc,ctmbstr prog)

{
  char cVar1;
  int *piVar2;
  CmdOptDesc *pCVar3;
  ctmbstr __src;
  ctmbstr ptVar4;
  size_t sVar5;
  ctmbstr ptVar6;
  char *pcVar7;
  char *s;
  char *sbuf;
  char *sbuf_00;
  char *s_00;
  char *pcVar8;
  tmbstr __ptr;
  TidyDoc p_Var9;
  CmdOptDesc *pCVar10;
  char *pcVar11;
  ctmbstr name;
  char *pc2;
  int iVar12;
  ulong uVar13;
  CmdOptDesc local_68;
  
  ptVar4 = tidyLocalizedString(0x353);
  sVar5 = strlen((char *)tdoc);
  if (sVar5 != 0) {
    piVar2 = &tdoc->_opaque;
    do {
      p_Var9 = (TidyDoc)((long)piVar2 + 1);
      cVar1 = *(char *)((long)&p_Var9[-1]._opaque + 3);
      if (((cVar1 == '\\') || (cVar1 == '/')) && ((char)p_Var9->_opaque != '\0')) {
        tdoc = p_Var9;
      }
      piVar2 = &p_Var9->_opaque;
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
  }
  ptVar6 = tidyLibraryVersion();
  printf(ptVar4,tdoc,ptVar6);
  putchar(10);
  ptVar4 = tidyPlatform();
  if (ptVar4 == (ctmbstr)0x0) {
    ptVar4 = tidyLocalizedString(0x355);
    pcVar7 = stringWithFormat(ptVar4);
  }
  else {
    ptVar4 = tidyLocalizedString(0x354);
    ptVar6 = tidyPlatform();
    pcVar7 = stringWithFormat(ptVar4,ptVar6);
  }
  sVar5 = strlen(pcVar7);
  if (0x4d < sVar5) {
    sVar5 = 0x4e;
  }
  puts(pcVar7);
  printf("%*.*s\n\n",sVar5 & 0xffffffff,sVar5 & 0xffffffff,
         "=================================================================");
  free(pcVar7);
  uVar13 = 0;
  do {
    ptVar4 = tidyLocalizedString(cmdopt_catname[uVar13].key);
    sVar5 = strlen(ptVar4);
    if (0x4d < sVar5) {
      sVar5 = 0x4e;
    }
    puts(ptVar4);
    printf("%*.*s\n",sVar5 & 0xffffffff,sVar5 & 0xffffffff,
           "-----------------------------------------------------------------");
    pCVar10 = cmdopt_defs;
    do {
      if (uVar13 == pCVar10->cat) {
        local_68.cat = pCVar10->cat;
        local_68._4_4_ = *(undefined4 *)&pCVar10->field_0x4;
        local_68.name1 = pCVar10->name1;
        local_68.key = pCVar10->key;
        local_68.subKey = pCVar10->subKey;
        local_68.eqconfig = pCVar10->eqconfig;
        local_68.name2 = pCVar10->name2;
        local_68.name3 = pCVar10->name3;
        localize_option_names(&local_68);
        ptVar4 = local_68.name1;
        sVar5 = strlen(local_68.name1);
        ptVar6 = local_68.name2;
        iVar12 = (int)sVar5;
        if (local_68.name2 != (char *)0x0) {
          sVar5 = strlen(local_68.name2);
          iVar12 = iVar12 + (int)sVar5 + 2;
        }
        __src = local_68.name3;
        if (local_68.name3 != (char *)0x0) {
          sVar5 = strlen(local_68.name3);
          iVar12 = iVar12 + (int)sVar5 + 2;
        }
        pcVar7 = (char *)malloc((ulong)(iVar12 + 1));
        if (pcVar7 == (char *)0x0) {
LAB_0013183e:
          outOfMemory();
        }
        strcpy(pcVar7,ptVar4);
        free(ptVar4);
        if (ptVar6 != (char *)0x0) {
          sVar5 = strlen(pcVar7);
          (pcVar7 + sVar5)[0] = ',';
          (pcVar7 + sVar5)[1] = ' ';
          pcVar7[sVar5 + 2] = '\0';
          strcat(pcVar7,ptVar6);
          free(ptVar6);
        }
        if (__src != (char *)0x0) {
          sVar5 = strlen(pcVar7);
          (pcVar7 + sVar5)[0] = ',';
          (pcVar7 + sVar5)[1] = ' ';
          pcVar7[sVar5 + 2] = '\0';
          strcat(pcVar7,__src);
          free(__src);
        }
        s = tidyLocalizedString(pCVar10->key);
        sbuf = (char *)malloc(0x1b);
        sbuf_00 = (char *)malloc(0x33);
        if ((sbuf == (char *)0x0) || (s_00 = pcVar7, sbuf_00 == (char *)0x0)) goto LAB_0013183e;
        do {
          s_00 = cutToWhiteSpace(s_00,0x1a,sbuf);
          s = cutToWhiteSpace(s,0x32,sbuf_00);
          pcVar11 = sbuf;
          if (*sbuf == '\0') {
            pcVar11 = "";
          }
          pcVar8 = sbuf_00;
          if (*sbuf_00 == '\0') {
            pcVar8 = "";
          }
          printf(" %-*.*s %-*.*s\n",0x1a,0x1a,pcVar11,0x32,0x32,pcVar8);
        } while (s_00 != (char *)0x0 || s != (char *)0x0);
        free(sbuf);
        free(sbuf_00);
        free(pcVar7);
      }
      pCVar3 = pCVar10 + 1;
      pCVar10 = pCVar10 + 1;
    } while (pCVar3->name1 != (ctmbstr)0x0);
    putchar(10);
    uVar13 = uVar13 + 1;
    if (uVar13 == 5) {
      putchar(10);
      ptVar4 = tidyLocalizedString(0x357);
      __ptr = stringWithFormat(ptVar4,"/etc/tidy.conf","~/.tidyrc");
      ptVar4 = tidyLocalizedString(0x356);
      printf(ptVar4,__ptr);
      free(__ptr);
      putchar(10);
      return;
    }
  } while( true );
}

Assistant:

static void help(TidyDoc tdoc, /**< The tidy document for which help is showing. */
                 ctmbstr prog  /**< The path of the current executable. */
                 )
{
    tmbstr temp_string = NULL;
    uint width = 78;

    printf( tidyLocalizedString(TC_TXT_HELP_1), get_final_name(prog), tidyLibraryVersion() );
    printf("\n");

    if ( tidyPlatform() )
        temp_string = stringWithFormat( tidyLocalizedString(TC_TXT_HELP_2A), tidyPlatform() );
    else
        temp_string = stringWithFormat( tidyLocalizedString(TC_TXT_HELP_2B) );

    width = width < strlen(temp_string) ? width : strlen(temp_string);
    printf( "%s\n", temp_string );
    printf( "%*.*s\n\n", width, width, ul);
    free( temp_string );

    print_help_options( tdoc );


    printf("\n");
#if defined(TIDY_CONFIG_FILE) && defined(TIDY_USER_CONFIG_FILE)
    temp_string = stringWithFormat( tidyLocalizedString(TC_TXT_HELP_3A), TIDY_CONFIG_FILE, TIDY_USER_CONFIG_FILE );
    printf( tidyLocalizedString(TC_TXT_HELP_3), temp_string );
    free( temp_string );
#else
    printf( tidyLocalizedString(TC_TXT_HELP_3), "\n" );
#endif
    printf("\n");
}